

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_disabled.cpp
# Opt level: O0

void test_trace(void)

{
  double __x;
  allocator<char> local_49;
  string local_48;
  
  SpyingSerial::clear(&Serial);
  SpyingSerial::log_abi_cxx11_((SpyingSerial *)&stack0xffffffffffffffd8,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  ASSERT_RE((string *)&stack0xffffffffffffffd8,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void test_trace() {
  Serial.clear();
  TRACE();
  ASSERT_RE(Serial.log(), "");
}